

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringOps.cpp
# Opt level: O1

string * __thiscall
gmlc::utilities::stringOps::trim_abi_cxx11_
          (string *__return_storage_ptr__,stringOps *this,string_view input,string_view whitespace)

{
  void *pvVar1;
  size_type sVar2;
  ulong uVar3;
  char *__n;
  char *pcVar4;
  stringOps *psVar5;
  stringOps *psVar6;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  __n = input._M_str;
  pcVar4 = (char *)input._M_len;
  psVar5 = (stringOps *)0xffffffffffffffff;
  local_40._M_len = (size_t)this;
  local_40._M_str = pcVar4;
  if (this != (stringOps *)0x0) {
    if (__n == (char *)0x0) {
      psVar5 = (stringOps *)0x0;
    }
    else {
      psVar6 = (stringOps *)0x0;
      do {
        pvVar1 = memchr((char *)whitespace._M_len,(int)pcVar4[(long)psVar6],(size_t)__n);
        psVar5 = psVar6;
        if (pvVar1 == (void *)0x0) break;
        psVar6 = psVar6 + 1;
        psVar5 = (stringOps *)0xffffffffffffffff;
      } while (this != psVar6);
    }
  }
  if (psVar5 == (stringOps *)0xffffffffffffffff) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                      (&local_40,(char *)whitespace._M_len,0xffffffffffffffff,(size_type)__n);
    if (local_40._M_len < psVar5) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 psVar5);
    }
    uVar3 = (sVar2 - (long)psVar5) + 1;
    if (local_40._M_len - (long)psVar5 < uVar3) {
      uVar3 = local_40._M_len - (long)psVar5;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,psVar5 + (long)local_40._M_str,
               psVar5 + (long)local_40._M_str + uVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string trim(std::string_view input, std::string_view whitespace)
    {
        const auto strStart = input.find_first_not_of(whitespace);
        if (strStart == std::string::npos) {
            return {};  // no content
        }

        const auto strEnd = input.find_last_not_of(whitespace);

        return std::string{input.substr(strStart, strEnd - strStart + 1)};
    }